

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_iterator.hpp
# Opt level: O0

void __thiscall
boost::algorithm::
split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::split_iterator(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *Other)

{
  find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  detail::
  find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::find_iterator_base(in_RSI,in_RDI);
  in_RDI[1].m_Finder.super_function_base.vtable = in_RSI[1].m_Finder.super_function_base.vtable;
  *(undefined8 *)&in_RDI[1].m_Finder.super_function_base.functor =
       *(undefined8 *)&in_RSI[1].m_Finder.super_function_base.functor;
  *(undefined8 *)((long)&in_RDI[1].m_Finder.super_function_base.functor + 8) =
       *(undefined8 *)((long)&in_RSI[1].m_Finder.super_function_base.functor + 8);
  *(undefined8 *)((long)&in_RDI[1].m_Finder.super_function_base.functor + 0x10) =
       *(undefined8 *)((long)&in_RSI[1].m_Finder.super_function_base.functor + 0x10);
  *(byte *)&in_RDI[2].m_Finder.super_function_base.vtable =
       *(byte *)&in_RSI[2].m_Finder.super_function_base.vtable & 1;
  return;
}

Assistant:

split_iterator( const split_iterator& Other ) :
                base_type(Other),
                m_Match(Other.m_Match),
                m_Next(Other.m_Next),
                m_End(Other.m_End),
                m_bEof(Other.m_bEof)
            {}